

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_log_perftest.cc
# Opt level: O2

bool WriteTestData(string *err)

{
  bool bVar1;
  bool bVar2;
  int start_time;
  int i;
  uint uVar3;
  ulong uVar4;
  int i_2;
  long lVar5;
  NoDeadPaths no_dead_paths;
  string long_rule_command;
  string build_rules;
  char buf_1 [80];
  BuildLog log;
  State state;
  ManifestParser parser;
  BuildLogUser local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  string local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258 [2];
  BuildLog local_200;
  State local_198;
  ManifestParser local_88;
  
  BuildLog::BuildLog(&local_200);
  local_2a0._vptr_BuildLogUser = (_func_int **)&PTR_IsPathDead_00133878;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"BuildLogPerfTest-tempfile",(allocator<char> *)&local_88);
  bVar1 = BuildLog::OpenForWrite(&local_200,(string *)&local_198,&local_2a0,err);
  std::__cxx11::string::~string((string *)&local_198);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_298,"gcc ",(allocator<char> *)&local_198);
    uVar4 = 0;
    while (local_298._M_string_length < 4000) {
      sprintf((char *)&local_198,"-I../../and/arbitrary/but/fairly/long/path/suffixed/%d ",uVar4);
      std::__cxx11::string::append((char *)&local_298);
      uVar4 = (ulong)((int)uVar4 + 1);
    }
    std::__cxx11::string::append((char *)&local_298);
    State::State(&local_198);
    ManifestParser::ManifestParser
              (&local_88,&local_198,(FileReader *)0x0,(ManifestParserOptions)0x0);
    std::operator+(local_258,"rule cxx\n  command = ",&local_298);
    bVar2 = ManifestParser::ParseTest(&local_88,local_258,err);
    std::__cxx11::string::~string((string *)local_258);
    bVar1 = false;
    if (bVar2) {
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      local_278._M_string_length = 0;
      local_278.field_2._M_local_buf[0] = '\0';
      for (uVar3 = 0; uVar3 != 30000; uVar3 = uVar3 + 1) {
        sprintf((char *)local_258,"build input%d.o: cxx input%d.cc\n",(ulong)uVar3,(ulong)uVar3);
        std::__cxx11::string::append((char *)&local_278);
      }
      bVar1 = ManifestParser::ParseTest(&local_88,&local_278,err);
      if (bVar1) {
        start_time = 0;
        for (lVar5 = 0; lVar5 != 30000; lVar5 = lVar5 + 1) {
          BuildLog::RecordCommand
                    (&local_200,
                     local_198.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar5],start_time,start_time + 1,0);
          start_time = start_time + 100;
        }
      }
      std::__cxx11::string::~string((string *)&local_278);
    }
    State::~State(&local_198);
    std::__cxx11::string::~string((string *)&local_298);
  }
  else {
    bVar1 = false;
  }
  BuildLog::~BuildLog(&local_200);
  return bVar1;
}

Assistant:

bool WriteTestData(string* err) {
  BuildLog log;

  NoDeadPaths no_dead_paths;
  if (!log.OpenForWrite(kTestFilename, no_dead_paths, err))
    return false;

  /*
  A histogram of command lengths in chromium. For example, 407 builds,
  1.4% of all builds, had commands longer than 32 bytes but shorter than 64.
       32    407   1.4%
       64    183   0.6%
      128   1461   5.1%
      256    791   2.8%
      512   1314   4.6%
     1024   6114  21.3%
     2048  11759  41.0%
     4096   2056   7.2%
     8192   4567  15.9%
    16384     13   0.0%
    32768      4   0.0%
    65536      5   0.0%
  The average command length is 4.1 kB and there were 28674 commands in total,
  which makes for a total log size of ~120 MB (also counting output filenames).

  Based on this, write 30000 many 4 kB long command lines.
  */

  // ManifestParser is the only object allowed to create Rules.
  const size_t kRuleSize = 4000;
  string long_rule_command = "gcc ";
  for (int i = 0; long_rule_command.size() < kRuleSize; ++i) {
    char buf[80];
    sprintf(buf, "-I../../and/arbitrary/but/fairly/long/path/suffixed/%d ", i);
    long_rule_command += buf;
  }
  long_rule_command += "$in -o $out\n";

  State state;
  ManifestParser parser(&state, NULL);
  if (!parser.ParseTest("rule cxx\n  command = " + long_rule_command, err))
    return false;

  // Create build edges. Using ManifestParser is as fast as using the State api
  // for edge creation, so just use that.
  const int kNumCommands = 30000;
  string build_rules;
  for (int i = 0; i < kNumCommands; ++i) {
    char buf[80];
    sprintf(buf, "build input%d.o: cxx input%d.cc\n", i, i);
    build_rules += buf;
  }

  if (!parser.ParseTest(build_rules, err))
    return false;

  for (int i = 0; i < kNumCommands; ++i) {
    log.RecordCommand(state.edges_[i],
                      /*start_time=*/100 * i,
                      /*end_time=*/100 * i + 1,
                      /*mtime=*/0);
  }

  return true;
}